

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O0

void __thiscall crnlib::mutex::mutex(mutex *this,uint spin_count)

{
  int iVar1;
  uint spin_count_local;
  mutex *this_local;
  
  iVar1 = pthread_mutex_init((pthread_mutex_t *)this,(pthread_mutexattr_t *)0x0);
  if (iVar1 != 0) {
    crnlib_fail("mutex::mutex: pthread_mutex_init() failed",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/crnlib/crn_threading_pthreads.cpp"
                ,0x59);
  }
  return;
}

Assistant:

mutex::mutex(unsigned int spin_count)
    {
        spin_count;

        if (pthread_mutex_init(&m_mutex, nullptr))
        {
            crnlib_fail("mutex::mutex: pthread_mutex_init() failed", __FILE__, __LINE__);
        }

#ifdef CRNLIB_BUILD_DEBUG
        m_lock_count = 0;
#endif
    }